

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O0

void __thiscall cmsys::Glob::AddExpression(Glob *this,string *expr)

{
  GlobInternals *pGVar1;
  string local_108;
  RegularExpression local_e8;
  string *local_18;
  string *expr_local;
  Glob *this_local;
  
  pGVar1 = this->Internals;
  local_18 = expr;
  expr_local = (string *)this;
  PatternToRegex(&local_108,expr,true,false);
  RegularExpression::RegularExpression(&local_e8,&local_108);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::push_back
            (&pGVar1->Expressions,&local_e8);
  RegularExpression::~RegularExpression(&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  return;
}

Assistant:

void Glob::AddExpression(const kwsys_stl::string& expr)
{
  this->Internals->Expressions.push_back(
    kwsys::RegularExpression(
      this->PatternToRegex(expr)));
}